

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::RunSelect(QL_Manager *this,QL_Node *topNode)

{
  char *data;
  char *buffer;
  RC it_rc;
  undefined1 local_68 [8];
  Printer printer;
  DataAttrInfo *attributes;
  int attrListSize;
  int *attrList;
  int finalTupLength;
  RC rc;
  QL_Node *topNode_local;
  QL_Manager *this_local;
  
  attrList._4_4_ = 0;
  _finalTupLength = topNode;
  topNode_local = (QL_Node *)this;
  QL_Node::GetTupleLength(topNode,(int *)&attrList);
  attrList._4_4_ =
       QL_Node::GetAttrList
                 (_finalTupLength,(int **)&stack0xffffffffffffffd0,(int *)((long)&attributes + 4));
  this_local._4_4_ = attrList._4_4_;
  if (attrList._4_4_ == 0) {
    printer._32_8_ = malloc((long)attributes._4_4_ * 0x44);
    attrList._4_4_ = SetUpPrinter(this,_finalTupLength,(DataAttrInfo *)printer._32_8_);
    this_local._4_4_ = attrList._4_4_;
    if (attrList._4_4_ == 0) {
      Printer::Printer((Printer *)local_68,(DataAttrInfo *)printer._32_8_,attributes._4_4_);
      Printer::PrintHeader((Printer *)local_68,(ostream *)&std::cout);
      attrList._4_4_ = (**_finalTupLength->_vptr_QL_Node)();
      this_local._4_4_ = attrList._4_4_;
      if (attrList._4_4_ == 0) {
        data = (char *)malloc((long)(int)attrList);
        buffer._4_4_ = (*_finalTupLength->_vptr_QL_Node[1])(_finalTupLength,data);
        while (buffer._4_4_ == 0) {
          Printer::Print((Printer *)local_68,(ostream *)&std::cout,data);
          buffer._4_4_ = (*_finalTupLength->_vptr_QL_Node[1])(_finalTupLength,data);
        }
        free(data);
        attrList._4_4_ = (*_finalTupLength->_vptr_QL_Node[3])();
        this_local._4_4_ = attrList._4_4_;
        if (attrList._4_4_ == 0) {
          Printer::PrintFooter((Printer *)local_68,(ostream *)&std::cout);
          free((void *)printer._32_8_);
          this_local._4_4_ = 0;
        }
      }
      Printer::~Printer((Printer *)local_68);
    }
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::RunSelect(QL_Node *topNode){
  RC rc = 0;
  // Retrieve the appropriate tuples that one is supposed to
  // print out by asking for the attribute information from the top node
  int finalTupLength;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  int attrListSize;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);

  // Set up the DatAttrInfo for the attributes to print
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, attributes)))
    return (rc);
  Printer printer(attributes, attrListSize);
  printer.PrintHeader(cout);

  // Open the iterator of the top node, and keep retrieving elements until
  // there are no more
  if((rc = topNode->OpenIt()))
    return (rc);
  RC it_rc = 0;
  char *buffer = (char *)malloc(finalTupLength);
  it_rc = topNode->GetNext(buffer);
  while(it_rc == 0){
    printer.Print(cout, buffer);
    it_rc = topNode->GetNext(buffer);
  }

  free(buffer);
  if((rc = topNode->CloseIt()))
    return (rc);

  printer.PrintFooter(cout);

  free(attributes);

  return (0);
}